

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconengine.cpp
# Opt level: O2

void __thiscall QIconEngine::virtual_hook(QIconEngine *this,int id,void *data)

{
  long in_FS_OFFSET;
  QSize local_40;
  QPixmap local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (id == 4) {
    local_40 = operator*((QSize *)data,*(qreal *)((long)data + 0x10));
    (*this->_vptr_QIconEngine[4])
              (&local_38,this,&local_40,(ulong)*(uint *)((long)data + 8),
               (ulong)*(uint *)((long)data + 0xc));
    QPixmap::operator=((QPixmap *)((long)data + 0x18),&local_38);
    QPixmap::~QPixmap(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconEngine::virtual_hook(int id, void *data)
{
    switch (id) {
    case QIconEngine::ScaledPixmapHook: {
        QIconEngine::ScaledPixmapArgument &arg =
            *reinterpret_cast<QIconEngine::ScaledPixmapArgument*>(data);
        // try to get a pixmap with the correct size, the dpr is adjusted later on
        arg.pixmap = pixmap(arg.size * arg.scale, arg.mode, arg.state);
        break;
    }
    default:
        break;
    }
}